

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

void __thiscall
phosg::BlockStringWriter::write_vprintf(BlockStringWriter *this,char *fmt,__va_list_tag *va)

{
  __va_list_tag *in_RCX;
  string local_40;
  __va_list_tag *local_20;
  __va_list_tag *va_local;
  char *fmt_local;
  BlockStringWriter *this_local;
  
  local_20 = va;
  va_local = (__va_list_tag *)fmt;
  fmt_local = (char *)this;
  string_vprintf_abi_cxx11_(&local_40,(phosg *)fmt,(char *)va,in_RCX);
  ::std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void BlockStringWriter::write_vprintf(const char* fmt, va_list va) {
  this->blocks.emplace_back(string_vprintf(fmt, va));
}